

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LValue.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::LValue::resolveInternal(LValue *this,optional<slang::ConstantRange> *range)

{
  __index_type _Var1;
  variant_alternative_t<1UL,_variant<monostate,_Path,_Concat>_> *pvVar2;
  long lVar3;
  pointer pvVar4;
  ConstantValue *target;
  ConstantValue *local_48;
  anon_class_16_2_7769f957 local_40;
  
  pvVar2 = std::get<1ul,std::monostate,slang::ast::LValue::Path,slang::ast::LValue::Concat>
                     (&this->value);
  local_48 = pvVar2->base;
  lVar3 = (pvVar2->elements).
          super_SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
          .len * 0x58;
  pvVar4 = (pvVar2->elements).
           super_SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
           .data_;
  while (((lVar3 != 0 && (local_48 != (ConstantValue *)0x0)) &&
         (*(__index_type *)
           ((long)&(local_48->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0x20) != '\0'))) {
    _Var1 = *(__index_type *)
             ((long)&(pvVar4->
                     super__Variant_base<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                     ).
                     super__Move_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                     .
                     super__Copy_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                     .
                     super__Move_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                     .
                     super__Copy_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
             + 0x50);
    local_40.target = &local_48;
    local_40.range = range;
    if (_Var1 == 0xff) {
      local_40.target = &local_48;
      std::__throw_bad_variant_access("std::visit: variant is valueless");
      _Var1 = *(__index_type *)
               ((long)&(pvVar4->
                       super__Variant_base<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                       ).
                       super__Move_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                       .
                       super__Copy_assign_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                       .
                       super__Move_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                       .
                       super__Copy_ctor_alias<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
               + 0x50);
    }
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/LValue.cpp:217:13)_&&,_std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_&>
      ::_S_vtable._M_arr[(char)_Var1]._M_data)(&local_40,pvVar4);
    pvVar4 = pvVar4 + 1;
    lVar3 = lVar3 + -0x58;
  }
  return local_48;
}

Assistant:

ConstantValue* LValue::resolveInternal(std::optional<ConstantRange>& range) {
    auto& path = std::get<Path>(value);
    ConstantValue* target = path.base;

    for (auto& elem : path.elements) {
        if (!target || target->bad())
            break;

        std::visit(
            [&target, &range](auto&& arg) {
                using T = std::decay_t<decltype(arg)>;
                if constexpr (std::is_same_v<T, BitSlice>) {
                    if (!range)
                        range = arg.range;
                    else
                        range = range->subrange(arg.range);
                }
                else if constexpr (std::is_same_v<T, ElementIndex>) {
                    if (arg.forceOutOfBounds) {
                        target = nullptr;
                    }
                    else if (target->isQueue()) {
                        auto& q = *target->queue();
                        if (arg.index < 0 || (q.maxBound && uint32_t(arg.index) > q.maxBound)) {
                            target = nullptr;
                        }
                        else {
                            // Queues can reference one past the end to insert a new element.
                            size_t idx = size_t(arg.index);
                            if (idx == q.size())
                                q.push_back(arg.defaultValue);

                            if (idx >= q.size())
                                target = nullptr;
                            else
                                target = &q[size_t(arg.index)];
                        }
                    }
                    else if (target->isUnion()) {
                        SLANG_ASSERT(arg.index >= 0);

                        auto& unionVal = target->unionVal();
                        if (unionVal->activeMember != uint32_t(arg.index)) {
                            unionVal->activeMember = uint32_t(arg.index);
                            unionVal->value = arg.defaultValue;
                        }
                        target = &unionVal->value;
                    }
                    else if (target->isString()) {
                        if (arg.index < 0 || size_t(arg.index) >= target->str().size())
                            target = nullptr;
                        else
                            range = ConstantRange{arg.index, arg.index};
                    }
                    else {
                        auto elems = target->elements();
                        if (arg.index < 0 || size_t(arg.index) >= elems.size())
                            target = nullptr;
                        else
                            target = &elems[size_t(arg.index)];
                    }
                }
                else if constexpr (std::is_same_v<T, ArraySlice>) {
                    range = arg.range;
                }
                else if constexpr (std::is_same_v<T, ArrayLookup>) {
                    auto& map = *target->map();
                    auto [it, inserted] = map.try_emplace(std::move(arg.index),
                                                          std::move(arg.defaultValue));

                    target = &it->second;
                }
                else {
                    static_assert(always_false<T>::value, "Missing case");
                }
            },
            elem);
    }

    return target;
}